

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

Gia_Man_t * Gia_ManFaultUnfold(Gia_Man_t *p,int fUseMuxes,int fFfOnly)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  undefined8 uVar7;
  int iVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *__dest;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  Gia_Obj_t *pGVar17;
  long lVar18;
  long lVar19;
  
  p_00 = Gia_ManStart((fUseMuxes * 3 + 2) * p->nObjs);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar9 = strlen(__s);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  iVar8 = p->nRegs;
  if (0 < iVar8) {
    iVar15 = 0;
    do {
      iVar1 = p->vCis->nSize;
      uVar14 = (iVar1 - iVar8) + iVar15;
      if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) goto LAB_00532091;
      iVar8 = p->vCis->pArray[uVar14];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00532072;
      pGVar17 = p->pObjs;
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
      pGVar17[iVar8].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      iVar15 = iVar15 + 1;
      iVar8 = p->nRegs;
    } while (iVar15 < iVar8);
  }
  pVVar11 = p->vCis;
  uVar13 = (ulong)(uint)pVVar11->nSize;
  if (p->nRegs < pVVar11->nSize) {
    lVar18 = 0;
    do {
      if ((int)uVar13 <= lVar18) goto LAB_00532091;
      iVar8 = pVVar11->pArray[lVar18];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00532072;
      pGVar17 = p->pObjs;
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
      pGVar17[iVar8].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar11 = p->vCis;
      uVar13 = (ulong)pVVar11->nSize;
    } while (lVar18 < (long)(uVar13 - (long)p->nRegs));
  }
  iVar8 = p->nObjs;
  if ((0 < iVar8) && (pGVar17 = p->pObjs, pGVar17 != (Gia_Obj_t *)0x0)) {
    lVar18 = 0;
    do {
      uVar13 = *(ulong *)pGVar17;
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        if ((int)pGVar17[-(uVar13 & 0x1fffffff)].Value < 0) goto LAB_005320b0;
        uVar14 = (uint)(uVar13 >> 0x20);
        if ((int)pGVar17[-(ulong)(uVar14 & 0x1fffffff)].Value < 0) goto LAB_005320b0;
        uVar14 = Gia_ManHashAnd(p_00,pGVar17[-(uVar13 & 0x1fffffff)].Value ^
                                     (uint)(uVar13 >> 0x1d) & 1,
                                pGVar17[-(ulong)(uVar14 & 0x1fffffff)].Value ^ uVar14 >> 0x1d & 1);
        pGVar17->Value = uVar14;
      }
      lVar18 = lVar18 + 1;
      iVar8 = p->nObjs;
    } while ((lVar18 < iVar8) && (pGVar17 = p->pObjs + lVar18, p->pObjs != (Gia_Obj_t *)0x0));
  }
  pVVar11 = p->vCos;
  iVar15 = pVVar11->nSize;
  if (0 < (long)iVar15) {
    piVar5 = pVVar11->pArray;
    lVar18 = 0;
    do {
      iVar1 = piVar5[lVar18];
      if (((long)iVar1 < 0) || (iVar8 <= iVar1)) goto LAB_00532072;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar17 = p->pObjs + iVar1;
      if ((int)pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value < 0)
      goto LAB_005320b0;
      pGVar17->Value =
           (uint)*(undefined8 *)pGVar17 >> 0x1d & 1 ^
           pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value;
      lVar18 = lVar18 + 1;
    } while (iVar15 != lVar18);
  }
  lVar18 = (long)p->nRegs;
  if (0 < lVar18) {
    pVVar6 = p->vCis;
    iVar1 = pVVar6->nSize;
    uVar14 = iVar1 - p->nRegs;
    uVar13 = (ulong)uVar14;
    do {
      if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) goto LAB_00532091;
      iVar2 = pVVar6->pArray[uVar13];
      if (((long)iVar2 < 0) || (iVar8 <= iVar2)) goto LAB_00532072;
      pGVar17 = p->pObjs;
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(undefined8 *)(pGVar17 + iVar2);
      if ((((uint)uVar7 & 0x9fffffff) != 0x9fffffff) ||
         (uVar16 = (uint)((ulong)uVar7 >> 0x20) & 0x1fffffff, (int)uVar16 < (int)uVar14)) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar16 = uVar16 + (iVar15 - iVar1);
      if (((int)uVar16 < 0) || (iVar15 <= (int)uVar16)) goto LAB_00532091;
      iVar3 = pVVar11->pArray[uVar16];
      if (((long)iVar3 < 0) || (iVar8 <= iVar3)) goto LAB_00532072;
      pGVar17[iVar2].Value = pGVar17[iVar3].Value;
      uVar13 = uVar13 + 1;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
  }
  pVVar11 = p->vCis;
  uVar13 = (ulong)(uint)pVVar11->nSize;
  if (p->nRegs < pVVar11->nSize) {
    lVar18 = 0;
    do {
      if ((int)uVar13 <= lVar18) goto LAB_00532091;
      iVar8 = pVVar11->pArray[lVar18];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00532072;
      pGVar17 = p->pObjs;
      if (pGVar17 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
      pGVar17[iVar8].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar11 = p->vCis;
      uVar13 = (ulong)pVVar11->nSize;
    } while (lVar18 < (long)(uVar13 - (long)p->nRegs));
  }
  if (fFfOnly == 0) {
    if (0 < p->nObjs) {
      lVar19 = 8;
      lVar18 = 0;
      do {
        pGVar17 = p->pObjs;
        if (pGVar17 == (Gia_Obj_t *)0x0) break;
        uVar14 = *(uint *)((long)pGVar17 + lVar19 + -8);
        if ((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) {
          pGVar10 = Gia_ManAppendObj(p_00);
          uVar13 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
          *(ulong *)pGVar10 =
               uVar13 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
          uVar13 = *(ulong *)((long)pGVar17 + lVar19 + -8);
          uVar14 = *(uint *)((long)pGVar17 + (ulong)(((uint)uVar13 & 0x1fffffff) << 2) * -3 + lVar19
                            );
          if (((int)uVar14 < 0) ||
             (uVar16 = *(uint *)((long)pGVar17 +
                                lVar19 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar16 < 0)) goto LAB_005320b0;
          iVar8 = Gia_ManHashAnd(p_00,(uint)(uVar13 >> 0x1d) & 1 ^ uVar14,
                                 uVar16 ^ (uint)(uVar13 >> 0x3d) & 1);
          if (fUseMuxes != 0) {
            iVar8 = Gia_ManHashMux(p_00,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) *
                                        0x55555556,*(int *)(&pGVar17->field_0x0 + lVar19),iVar8);
          }
          *(int *)(&pGVar17->field_0x0 + lVar19) = iVar8;
        }
        lVar18 = lVar18 + 1;
        lVar19 = lVar19 + 0xc;
      } while (lVar18 < p->nObjs);
    }
    pVVar11 = p->vCos;
    if (0 < pVVar11->nSize) {
      lVar18 = 0;
      do {
        iVar8 = pVVar11->pArray[lVar18];
        if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00532072;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar17 = p->pObjs + iVar8;
        if ((int)pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value < 0)
        goto LAB_005320b0;
        uVar14 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar17 >> 0x1d & 1 ^
                                      pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].
                                      Value);
        pGVar17->Value = uVar14;
        lVar18 = lVar18 + 1;
        pVVar11 = p->vCos;
      } while (lVar18 < pVVar11->nSize);
    }
  }
  else {
    if (0 < p->nObjs) {
      lVar19 = 8;
      lVar18 = 0;
      do {
        pGVar17 = p->pObjs;
        if (pGVar17 == (Gia_Obj_t *)0x0) break;
        uVar13 = *(ulong *)((long)pGVar17 + lVar19 + -8);
        if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
          uVar14 = *(uint *)((long)pGVar17 +
                            lVar19 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
          if (((int)uVar14 < 0) ||
             (uVar16 = *(uint *)((long)pGVar17 +
                                lVar19 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar16 < 0)) goto LAB_005320b0;
          iVar8 = Gia_ManHashAnd(p_00,uVar14 ^ (uint)(uVar13 >> 0x1d) & 1,
                                 uVar16 ^ (uint)(uVar13 >> 0x3d) & 1);
          *(int *)(&pGVar17->field_0x0 + lVar19) = iVar8;
        }
        lVar18 = lVar18 + 1;
        lVar19 = lVar19 + 0xc;
      } while (lVar18 < p->nObjs);
    }
    pVVar11 = p->vCos;
    uVar13 = (ulong)(uint)pVVar11->nSize;
    if (p->nRegs < pVVar11->nSize) {
      lVar18 = 0;
      do {
        if ((int)uVar13 <= lVar18) goto LAB_00532091;
        iVar8 = pVVar11->pArray[lVar18];
        if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_00532072;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar17 = p->pObjs + iVar8;
        if ((int)pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value < 0)
        goto LAB_005320b0;
        uVar14 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar17 >> 0x1d & 1 ^
                                      pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].
                                      Value);
        pGVar17->Value = uVar14;
        lVar18 = lVar18 + 1;
        pVVar11 = p->vCos;
        uVar13 = (ulong)pVVar11->nSize;
      } while (lVar18 < (long)(uVar13 - (long)p->nRegs));
    }
    iVar8 = p->nRegs;
    if (0 < iVar8) {
      iVar15 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar14 = (iVar1 - iVar8) + iVar15;
        if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) {
LAB_00532091:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar8 = p->vCos->pArray[uVar14];
        if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
LAB_00532072:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar17 = p->pObjs;
        if (pGVar17 == (Gia_Obj_t *)0x0) break;
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar13 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar13 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_00532053:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_00532053;
        pGVar17 = pGVar17 + iVar8;
        if ((int)pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value < 0) {
LAB_005320b0:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        uVar14 = (uint)*(undefined8 *)pGVar17 >> 0x1d & 1 ^
                 pGVar17[-(ulong)((uint)*(undefined8 *)pGVar17 & 0x1fffffff)].Value;
        if (fUseMuxes != 0) {
          uVar14 = Gia_ManHashMux(p_00,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) *
                                       0x55555556,pGVar17->Value,uVar14);
        }
        pGVar17->Value = uVar14;
        uVar14 = Gia_ManAppendCo(p_00,uVar14);
        pGVar17->Value = uVar14;
        iVar15 = iVar15 + 1;
        iVar8 = p->nRegs;
      } while (iVar15 < iVar8);
    }
  }
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar15 = p->nRegs;
  iVar1 = p->vCis->nSize;
  iVar8 = iVar15 + (iVar1 - iVar15) * 2;
  if (fFfOnly == 0) {
    iVar15 = ~(iVar1 + p->vCos->nSize) + p->nObjs;
  }
  if (pGVar12->vCis->nSize - pGVar12->nRegs != iVar8 + iVar15) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManRegNum(p) + 2 * Gia_ManPiNum(p) + (fFfOnly ? Gia_ManRegNum(p) : Gia_ManAndNum(p))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                  ,0x177,"Gia_Man_t *Gia_ManFaultUnfold(Gia_Man_t *, int, int)");
  }
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManFaultUnfold( Gia_Man_t * p, int fUseMuxes, int fFfOnly )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl, iThis;
    pNew = Gia_ManStart( (2 + 3 * fUseMuxes) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    // add first timeframe
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // add second timeframe
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ObjRoToRi(p, pObj)->Value;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    if ( fFfOnly )
    {
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
        {
            iCtrl = Gia_ManAppendCi(pNew);
            iThis = Gia_ObjFanin0Copy(pObj);
            if ( fUseMuxes )
                pObj->Value = Gia_ManHashMux( pNew, iCtrl, pObj->Value, iThis );
            else
                pObj->Value = iThis;
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            iCtrl = Gia_ManAppendCi(pNew);
            iThis = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( fUseMuxes )
                pObj->Value = Gia_ManHashMux( pNew, iCtrl, pObj->Value, iThis );
            else
                pObj->Value = iThis;
        }
        Gia_ManForEachCo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManRegNum(p) + 2 * Gia_ManPiNum(p) + (fFfOnly ? Gia_ManRegNum(p) : Gia_ManAndNum(p)) );
    return pNew;
}